

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_proxy_module.c
# Opt level: O2

char * ngx_http_proxy_pass(ngx_conf_t *cf,ngx_command_t *cmd,void *conf)

{
  ngx_str_t *value;
  long *plVar1;
  void *pvVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  u_char *puVar5;
  long lVar6;
  ngx_int_t nVar7;
  ngx_http_upstream_srv_conf_t *pnVar8;
  char *pcVar9;
  undefined1 local_110 [80];
  ngx_sockaddr_t local_c0;
  ngx_str_t *local_38;
  
  pcVar9 = "is duplicate";
  if ((*conf == 0) && (*(long *)((long)conf + 0x238) == 0)) {
    plVar1 = *(long **)(*(long *)((long)cf->ctx + 0x10) + ngx_http_core_module.ctx_index * 8);
    plVar1[9] = (long)ngx_http_proxy_handler;
    if (*(char *)(plVar1[1] + -1 + *plVar1) == '/') {
      *(byte *)(plVar1 + 3) = *(byte *)(plVar1 + 3) | 0x20;
    }
    pvVar2 = cf->args->elts;
    value = (ngx_str_t *)((long)pvVar2 + 0x10);
    local_110._40_8_ = ngx_http_script_variables_count(value);
    if ((u_char *)local_110._40_8_ == (u_char *)0x0) {
      nVar7 = ngx_strncasecmp(*(u_char **)((long)pvVar2 + 0x18),(u_char *)"http://",7);
      if (nVar7 == 0) {
        local_38 = value;
        memset(local_110 + 0x10,0,200);
        local_110._0_8_ = *(long *)((long)pvVar2 + 0x10) + -7;
        local_110._8_8_ = *(long *)((long)pvVar2 + 0x18) + 7;
        local_110._66_2_ = 0x50;
        local_110[0x48] = 6;
        pnVar8 = ngx_http_upstream_add(cf,(ngx_url_t *)local_110,0);
        *(ngx_http_upstream_srv_conf_t **)conf = pnVar8;
        pcVar9 = (char *)0xffffffffffffffff;
        if (pnVar8 != (ngx_http_upstream_srv_conf_t *)0x0) {
          *(undefined8 *)((long)conf + 0x2c0) = 7;
          *(undefined8 *)((long)conf + 0x2c8) = *(undefined8 *)((long)pvVar2 + 0x18);
          *(undefined8 *)((long)conf + 0x2b0) = *(undefined8 *)((long)conf + 0x2c0);
          *(undefined8 *)((long)conf + 0x2b8) = *(undefined8 *)((long)conf + 0x2c8);
          ngx_http_proxy_set_vars
                    ((ngx_url_t *)local_110,(ngx_http_proxy_vars_t *)((long)conf + 0x2b0));
          uVar3 = *(undefined4 *)((long)plVar1 + 4);
          lVar6 = plVar1[1];
          uVar4 = *(undefined4 *)((long)plVar1 + 0xc);
          *(int *)((long)conf + 0x268) = (int)*plVar1;
          *(undefined4 *)((long)conf + 0x26c) = uVar3;
          *(int *)((long)conf + 0x270) = (int)lVar6;
          *(undefined4 *)((long)conf + 0x274) = uVar4;
          if ((((*(ushort *)(plVar1 + 3) & 4) != 0) || ((*(ushort *)(plVar1 + 3) & 1) != 0)) ||
             (plVar1[2] != 0)) {
            if (*(long *)((long)conf + 0x2f0) != 0) {
              ngx_conf_log_error(1,cf,0,
                                 "\"proxy_pass\" cannot have URI part in location given by regular expression, or inside named location, or inside \"if\" statement, or inside \"limit_except\" block"
                                );
              return (char *)0xffffffffffffffff;
            }
            *(undefined8 *)((long)conf + 0x268) = 0;
          }
          puVar5 = local_38->data;
          *(size_t *)((long)conf + 0x278) = local_38->len;
          *(u_char **)((long)conf + 0x280) = puVar5;
          pcVar9 = (char *)0x0;
        }
      }
      else {
        nVar7 = ngx_strncasecmp(*(u_char **)((long)pvVar2 + 0x18),(u_char *)"https://",8);
        if (nVar7 == 0) {
          pcVar9 = "https protocol requires SSL support";
        }
        else {
          pcVar9 = "invalid URL prefix";
        }
        ngx_conf_log_error(1,cf,0,pcVar9);
        pcVar9 = (char *)0xffffffffffffffff;
      }
    }
    else {
      local_110._24_8_ = (long)conf + 0x238;
      local_110._16_8_ = (ngx_array_t **)0x0;
      local_110._64_8_ = 0;
      local_110._72_8_ = (void *)0x0;
      local_110._48_8_ = 0;
      local_110._56_8_ = (u_char *)0x0;
      local_110._32_8_ = (long)conf + 0x240;
      local_c0._0_8_ = 6;
      local_110._0_8_ = cf;
      local_110._8_8_ = value;
      nVar7 = ngx_http_script_compile((ngx_http_script_compile_t *)local_110);
      pcVar9 = (char *)-(ulong)(nVar7 != 0);
    }
  }
  return pcVar9;
}

Assistant:

static char *
ngx_http_proxy_pass(ngx_conf_t *cf, ngx_command_t *cmd, void *conf)
{
    ngx_http_proxy_loc_conf_t *plcf = conf;

    size_t                      add;
    u_short                     port;
    ngx_str_t                  *value, *url;
    ngx_url_t                   u;
    ngx_uint_t                  n;
    ngx_http_core_loc_conf_t   *clcf;
    ngx_http_script_compile_t   sc;

    if (plcf->upstream.upstream || plcf->proxy_lengths) {
        return "is duplicate";
    }

    clcf = ngx_http_conf_get_module_loc_conf(cf, ngx_http_core_module);

    clcf->handler = ngx_http_proxy_handler;

    if (clcf->name.data[clcf->name.len - 1] == '/') {
        clcf->auto_redirect = 1;
    }

    value = cf->args->elts;

    url = &value[1];

    n = ngx_http_script_variables_count(url);

    if (n) {

        ngx_memzero(&sc, sizeof(ngx_http_script_compile_t));

        sc.cf = cf;
        sc.source = url;
        sc.lengths = &plcf->proxy_lengths;
        sc.values = &plcf->proxy_values;
        sc.variables = n;
        sc.complete_lengths = 1;
        sc.complete_values = 1;

        if (ngx_http_script_compile(&sc) != NGX_OK) {
            return NGX_CONF_ERROR;
        }

#if (NGX_HTTP_SSL)
        plcf->ssl = 1;
#endif

        return NGX_CONF_OK;
    }

    if (ngx_strncasecmp(url->data, (u_char *) "http://", 7) == 0) {
        add = 7;
        port = 80;

    } else if (ngx_strncasecmp(url->data, (u_char *) "https://", 8) == 0) {

#if (NGX_HTTP_SSL)
        plcf->ssl = 1;

        add = 8;
        port = 443;
#else
        ngx_conf_log_error(NGX_LOG_EMERG, cf, 0,
                           "https protocol requires SSL support");
        return NGX_CONF_ERROR;
#endif

    } else {
        ngx_conf_log_error(NGX_LOG_EMERG, cf, 0, "invalid URL prefix");
        return NGX_CONF_ERROR;
    }

    ngx_memzero(&u, sizeof(ngx_url_t));

    u.url.len = url->len - add;
    u.url.data = url->data + add;
    u.default_port = port;
    u.uri_part = 1;
    u.no_resolve = 1;

    plcf->upstream.upstream = ngx_http_upstream_add(cf, &u, 0);
    if (plcf->upstream.upstream == NULL) {
        return NGX_CONF_ERROR;
    }

    plcf->vars.schema.len = add;
    plcf->vars.schema.data = url->data;
    plcf->vars.key_start = plcf->vars.schema;

    ngx_http_proxy_set_vars(&u, &plcf->vars);

    plcf->location = clcf->name;

    if (clcf->named
#if (NGX_PCRE)
        || clcf->regex
#endif
        || clcf->noname)
    {
        if (plcf->vars.uri.len) {
            ngx_conf_log_error(NGX_LOG_EMERG, cf, 0,
                               "\"proxy_pass\" cannot have URI part in "
                               "location given by regular expression, "
                               "or inside named location, "
                               "or inside \"if\" statement, "
                               "or inside \"limit_except\" block");
            return NGX_CONF_ERROR;
        }

        plcf->location.len = 0;
    }

    plcf->url = *url;

    return NGX_CONF_OK;
}